

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O1

int do_restart(int nargs,char **args)

{
  service *svc;
  
  svc = service_find_by_name(args[1]);
  if (svc != (service *)0x0) {
    service_stop(svc);
    service_start(svc,(char *)0x0);
  }
  return 0;
}

Assistant:

int do_restart(int nargs, char **args)
{
    struct service *svc;
    svc = service_find_by_name(args[1]);
    if (svc) {
        service_stop(svc);
        service_start(svc, NULL);
    }
    return 0;
}